

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_stream_socket.c
# Opt level: O3

void oonf_stream_add_managed(oonf_stream_managed *managed)

{
  if ((managed->config).allowed_sessions == 0) {
    (managed->config).allowed_sessions = 10;
  }
  if ((managed->config).maximum_input_buffer == 0) {
    (managed->config).maximum_input_buffer = 0x10000;
  }
  if ((managed->config).session_timeout == 0) {
    (managed->config).session_timeout = 120000;
  }
  (managed->_if_listener).if_changed = _cb_interface_listener;
  (managed->_if_listener).name = (managed->_managed_config).interface;
  return;
}

Assistant:

void
oonf_stream_add_managed(struct oonf_stream_managed *managed) {
  if (managed->config.allowed_sessions == 0) {
    managed->config.allowed_sessions = 10;
  }
  if (managed->config.maximum_input_buffer == 0) {
    managed->config.maximum_input_buffer = 65536;
  }
  if (managed->config.session_timeout == 0) {
    managed->config.session_timeout = 120000;
  }

  managed->_if_listener.if_changed = _cb_interface_listener;
  managed->_if_listener.name = managed->_managed_config.interface;
}